

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
::Container::Container
          (Container *this,int d,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *c)

{
  undefined4 in_ESI;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_RDI;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *this_00;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_1f8;
  undefined4 local_c;
  
  this_00 = &local_1f8;
  local_c = in_ESI;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint(this_00,in_RDI);
  ExprWrapper<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::ExprWrapper
            ((ExprWrapper<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *)
             this_00,in_RDI);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(this_00);
  *(undefined4 *)&in_RDI[1].super_BasicConstraint.name_ = local_c;
  Context::Context((Context *)&in_RDI[1].super_BasicConstraint.name_.field_0x4,CTX_NONE);
  *(undefined1 *)&in_RDI[1].super_BasicConstraint.name_._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 2) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }